

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::PackedInt32::_InternalSerialize
          (PackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_24_1_493b367e_for_PackedInt32_3 *this_00;
  bool bVar1;
  int iVar2;
  int *piVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  void *unaff_R12;
  int *piVar10;
  undefined8 *puVar11;
  
  uVar9 = *(uint *)((long)&this->field_0 + 0x10);
  if ((int)uVar9 < 1) {
LAB_001c992a:
    uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar7 & 1) == 0) {
      return target;
    }
    unaff_R12 = *(void **)((uVar7 & 0xfffffffffffffffe) + 8);
    this = (PackedInt32 *)(this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)this & 1) == 0) {
      puVar11 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
      goto LAB_001c996e;
    }
  }
  else {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      this_00 = &this->field_0;
      uVar8 = 0x4002;
      do {
        pbVar4 = target;
        *pbVar4 = (byte)uVar8 | 0x80;
        target = pbVar4 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar1);
      *target = 1;
      pbVar4 = pbVar4 + 2;
      uVar8 = uVar9;
      if (0x7f < uVar9) {
        do {
          target = pbVar4;
          *target = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          pbVar4 = target + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
      }
      *pbVar4 = (byte)uVar9;
      if ((undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) ==
          (undefined1  [24])0x0) {
        piVar3 = (int *)((long)&this->field_0 + 8);
      }
      else {
        piVar3 = (int *)google::protobuf::internal::LongSooRep::elements
                                  ((LongSooRep *)&this_00->_impl_);
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size
                        ((SooRep *)&this_00->_impl_,
                         (undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) ==
                         (undefined1  [24])0x0);
      piVar10 = piVar3 + iVar2;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar6 = (ulong)*piVar3;
        uVar7 = uVar6;
        if (0x7f < uVar6) {
          do {
            *target = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            target = target + 1;
            bVar1 = 0x3fff < uVar7;
            uVar7 = uVar6;
          } while (bVar1);
        }
        piVar3 = piVar3 + 1;
        *target = (byte)uVar6;
        target = target + 1;
      } while (piVar3 < piVar10);
      goto LAB_001c992a;
    }
    _InternalSerialize();
  }
  puVar11 = (undefined8 *)(((ulong)this & 0xfffffffffffffffe) + 8);
LAB_001c996e:
  uVar9 = *(uint *)(puVar11 + 1);
  if ((long)(int)uVar9 <= (long)stream->end_ - (long)target) {
    memcpy(target,unaff_R12,(ulong)uVar9);
    return target + (int)uVar9;
  }
  puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                     (stream,unaff_R12,uVar9,target);
  return puVar5;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL PackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const PackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.PackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048 [features = {
  {
    int byte_size = this_._impl_._repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2048, this_._internal_repeated_int32(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.PackedInt32)
  return target;
}